

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O2

double __thiscall base_uint<256U>::getdouble(base_uint<256U> *this)

{
  long lVar1;
  long in_FS_OFFSET;
  double dVar2;
  double dVar3;
  
  dVar3 = 1.0;
  dVar2 = 0.0;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    dVar2 = dVar2 + (double)this->pn[lVar1] * dVar3;
    dVar3 = dVar3 * 4294967296.0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return dVar2;
  }
  __stack_chk_fail();
}

Assistant:

double base_uint<BITS>::getdouble() const
{
    double ret = 0.0;
    double fact = 1.0;
    for (int i = 0; i < WIDTH; i++) {
        ret += fact * pn[i];
        fact *= 4294967296.0;
    }
    return ret;
}